

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O0

void mathCore::recursive_combine_equiv(expression *a)

{
  bool bVar1;
  reference ppeVar2;
  expression *child;
  iterator __end1;
  iterator __begin1;
  expSet *__range1;
  expression *a_local;
  
  __end1 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                     (&a->contents);
  child = (expression *)
          std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end(&a->contents)
  ;
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&child);
    if (!bVar1) break;
    ppeVar2 = std::_Rb_tree_const_iterator<expression_*>::operator*(&__end1);
    recursive_combine_equiv(*ppeVar2);
    std::_Rb_tree_const_iterator<expression_*>::operator++(&__end1);
  }
  combine_equiv(a);
  return;
}

Assistant:

void mathCore::recursive_combine_equiv(expression* a) {
	for (auto child : a->contents) {
		mathCore::recursive_combine_equiv(child);
	}
	mathCore::combine_equiv(a);
}